

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_util.cpp
# Opt level: O2

void duckdb::ExtensionUtil::RegisterFunction(DatabaseInstance *db,PragmaFunction *function)

{
  PragmaFunctionSet set;
  string local_1c0;
  FunctionSet<duckdb::PragmaFunction> local_1a0;
  FunctionSet<duckdb::PragmaFunction> local_168;
  PragmaFunction local_130;
  
  ::std::__cxx11::string::string
            ((string *)&local_1c0,
             (string *)
             &(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
              name);
  PragmaFunctionSet::PragmaFunctionSet((PragmaFunctionSet *)&local_1a0,&local_1c0);
  ::std::__cxx11::string::~string((string *)&local_1c0);
  PragmaFunction::PragmaFunction(&local_130,function);
  ::std::vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>::
  emplace_back<duckdb::PragmaFunction>
            (&local_1a0.functions.
              super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>,
             &local_130);
  PragmaFunction::~PragmaFunction(&local_130);
  FunctionSet<duckdb::PragmaFunction>::FunctionSet(&local_168,&local_1a0);
  RegisterFunction(db,(PragmaFunctionSet *)&local_168);
  FunctionSet<duckdb::PragmaFunction>::~FunctionSet(&local_168);
  FunctionSet<duckdb::PragmaFunction>::~FunctionSet(&local_1a0);
  return;
}

Assistant:

void ExtensionUtil::RegisterFunction(DatabaseInstance &db, PragmaFunction function) {
	D_ASSERT(!function.name.empty());
	PragmaFunctionSet set(function.name);
	set.AddFunction(std::move(function));
	RegisterFunction(db, std::move(set));
}